

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdInParse.cpp
# Opt level: O2

int main(int argC,char **argV)

{
  int iVar1;
  SAXParser *this;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  long lVar6;
  StrX local_a8;
  StdInParseHandlers handler;
  StdInInputSource src;
  
  pcVar4 = (char *)0x0;
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  lVar6 = 1;
  while( true ) {
    if ((argC <= lVar6) || (pcVar3 = argV[lVar6], *pcVar3 != '-')) {
      this = (SAXParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0x108,(ulong)pcVar4);
      xercesc_4_0::SAXParser::SAXParser
                (this,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
                 (XMLGrammarPool *)0x0);
      xercesc_4_0::SAXParser::setValidationScheme((ValSchemes)this);
      bVar5 = SUB81(this,0);
      xercesc_4_0::SAXParser::setDoNamespaces(bVar5);
      xercesc_4_0::SAXParser::setDoSchema(bVar5);
      xercesc_4_0::SAXParser::setHandleMultipleImports(bVar5);
      xercesc_4_0::SAXParser::setValidationSchemaFullChecking(bVar5);
      StdInParseHandlers::StdInParseHandlers(&handler);
      (**(code **)(*(long *)this + 0x20))(this,&handler.super_HandlerBase.super_DocumentHandler);
      (**(code **)(*(long *)this + 0x28))(this,&handler.super_HandlerBase.super_ErrorHandler);
      xercesc_4_0::StdInInputSource::StdInInputSource
                (&src,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
      (**(code **)(*(long *)this + 0x30))(this,&src);
      xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
      iVar1 = xercesc_4_0::SAXParser::getErrorCount();
      if (iVar1 == 0) {
        StrX::StrX(&local_a8,(XMLCh *)src._32_8_);
        std::operator<<((ostream *)&std::cout,local_a8.fLocalForm);
        poVar2 = std::operator<<((ostream *)&std::cout,": ");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        poVar2 = std::operator<<(poVar2," ms (");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        poVar2 = std::operator<<(poVar2," elems, ");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        poVar2 = std::operator<<(poVar2," attrs, ");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        poVar2 = std::operator<<(poVar2," spaces, ");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        poVar2 = std::operator<<(poVar2," chars)");
        std::endl<char,std::char_traits<char>>(poVar2);
        StrX::~StrX(&local_a8);
      }
      xercesc_4_0::InputSource::~InputSource(&src.super_InputSource);
      (**(code **)(*(long *)this + 8))(this);
      xercesc_4_0::XMLPlatformUtils::Terminate();
      StdInParseHandlers::~StdInParseHandlers(&handler);
      return (uint)(0 < iVar1) << 2;
    }
    if ((pcVar3[1] == '?') && (pcVar3[2] == '\0')) break;
    if (((pcVar3[1] == 'v') && (pcVar3[2] == '=')) || ((pcVar3[1] == 'V' && (pcVar3[2] == '=')))) {
      pcVar3 = pcVar3 + 3;
      pcVar4 = "never";
      iVar1 = strcmp(pcVar3,"never");
      if (iVar1 == 0) {
        valScheme = Val_Never;
      }
      else {
        pcVar4 = "auto";
        iVar1 = strcmp(pcVar3,"auto");
        if (iVar1 == 0) {
          valScheme = Val_Auto;
        }
        else {
          pcVar4 = "always";
          iVar1 = strcmp(pcVar3,"always");
          if (iVar1 != 0) {
            poVar2 = std::operator<<((ostream *)&std::cerr,"Unknown -v= value: ");
            poVar2 = std::operator<<(poVar2,pcVar3);
            std::endl<char,std::char_traits<char>>(poVar2);
            goto LAB_001036fc;
          }
          valScheme = Val_Always;
        }
      }
    }
    else if (((pcVar3[1] == 'n') && (pcVar3[2] == '\0')) ||
            ((pcVar3[1] == 'N' && (pcVar3[2] == '\0')))) {
      doNamespaces = 1;
    }
    else if (((pcVar3[1] == 's') && (pcVar3[2] == '\0')) ||
            ((pcVar3[1] == 'S' && (pcVar3[2] == '\0')))) {
      doSchema = 1;
    }
    else if (((pcVar3[1] == 'f') && (pcVar3[2] == '\0')) ||
            ((pcVar3[1] == 'F' && (pcVar3[2] == '\0')))) {
      schemaFullChecking = 1;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Unknown option \'");
      poVar2 = std::operator<<(poVar2,argV[lVar6]);
      pcVar4 = "\', ignoring it\n";
      poVar2 = std::operator<<(poVar2,"\', ignoring it\n");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    lVar6 = lVar6 + 1;
  }
  usage();
LAB_001036fc:
  xercesc_4_0::XMLPlatformUtils::Terminate();
  return 2;
}

Assistant:

int main(int argC, char* argV[])
{
    // Initialize the XML4C system
    try
    {
         XMLPlatformUtils::Initialize();
    }

    catch (const XMLException& toCatch)
    {
         std::cerr << "Error during initialization! Message:\n"
              << StrX(toCatch.getMessage()) << std::endl;
         return 1;
    }

    int parmInd;
    for (parmInd = 1; parmInd < argC; parmInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[parmInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[parmInd], "-?"))
        {
            usage();
            XMLPlatformUtils::Terminate();
            return 2;
        }
         else if (!strncmp(argV[parmInd], "-v=", 3)
              ||  !strncmp(argV[parmInd], "-V=", 3))
        {
            const char* const parm = &argV[parmInd][3];

            if (!strcmp(parm, "never"))
                valScheme = SAXParser::Val_Never;
            else if (!strcmp(parm, "auto"))
                valScheme = SAXParser::Val_Auto;
            else if (!strcmp(parm, "always"))
                valScheme = SAXParser::Val_Always;
            else
            {
                std::cerr << "Unknown -v= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }
        }
         else if (!strcmp(argV[parmInd], "-n")
              ||  !strcmp(argV[parmInd], "-N"))
        {
            doNamespaces = true;
        }
         else if (!strcmp(argV[parmInd], "-s")
              ||  !strcmp(argV[parmInd], "-S"))
        {
            doSchema = true;
        }
         else if (!strcmp(argV[parmInd], "-f")
              ||  !strcmp(argV[parmInd], "-F"))
        {
            schemaFullChecking = true;
        }
         else
        {
            std::cerr << "Unknown option '" << argV[parmInd]
                 << "', ignoring it\n" << std::endl;
        }
    }

    //
    //  Create a SAX parser object. Then, according to what we were told on
    //  the command line, set the options.
    //
    SAXParser* parser = new SAXParser;
    parser->setValidationScheme(valScheme);
    parser->setDoNamespaces(doNamespaces);
    parser->setDoSchema(doSchema);
    parser->setHandleMultipleImports (true);
    parser->setValidationSchemaFullChecking(schemaFullChecking);


    //
    //  Create our SAX handler object and install it on the parser, as the
    //  document and error handler. We are responsible for cleaning them
    //  up, but since its just stack based here, there's nothing special
    //  to do.
    //
    StdInParseHandlers handler;
    parser->setDocumentHandler(&handler);
    parser->setErrorHandler(&handler);

    unsigned long duration;
    int errorCount = 0;
    // create a faux scope so that 'src' destructor is called before
    // XMLPlatformUtils::Terminate
    {
        //
        //  Kick off the parse and catch any exceptions. Create a standard
        //  input input source and tell the parser to parse from that.
        //
        StdInInputSource src;
        try
        {
            const unsigned long startMillis = XMLPlatformUtils::getCurrentMillis();
            parser->parse(src);
            const unsigned long endMillis = XMLPlatformUtils::getCurrentMillis();
            duration = endMillis - startMillis;
            errorCount = parser->getErrorCount();
        }
        catch (const OutOfMemoryException&)
        {
            std::cerr << "OutOfMemoryException" << std::endl;
            errorCount = 2;
            return 4;
        }
        catch (const XMLException& e)
        {
            std::cerr << "\nError during parsing: \n"
                 << StrX(e.getMessage())
                 << "\n" << std::endl;
            errorCount = 1;
            return 4;
        }

        // Print out the stats that we collected and time taken
        if (!errorCount) {
            std::cout << StrX(src.getSystemId()) << ": " << duration << " ms ("
                 << handler.getElementCount() << " elems, "
                 << handler.getAttrCount() << " attrs, "
                 << handler.getSpaceCount() << " spaces, "
                 << handler.getCharacterCount() << " chars)" << std::endl;
        }
    }

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    delete parser;

    XMLPlatformUtils::Terminate();

    if (errorCount > 0)
        return 4;
    else
        return 0;
}